

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O2

JDIMENSION load_interlaced_image(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  uint uVar1;
  JDIMENSION JVar2;
  jpeg_progress_mgr *pjVar3;
  JSAMPROW pJVar4;
  int iVar5;
  JSAMPARRAY ppJVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  pjVar3 = cinfo->progress;
  uVar9 = 0;
  while( true ) {
    uVar1 = cinfo->image_height;
    if (uVar1 <= uVar9) break;
    if (pjVar3 != (jpeg_progress_mgr *)0x0) {
      pjVar3->pass_counter = uVar9;
      pjVar3->pass_limit = (ulong)uVar1;
      (*pjVar3->progress_monitor)((j_common_ptr)cinfo);
    }
    ppJVar6 = (*cinfo->mem->access_virt_sarray)
                        ((j_common_ptr)cinfo,(jvirt_sarray_ptr)sinfo[8].buffer,(JDIMENSION)uVar9,1,1
                        );
    pJVar4 = *ppJVar6;
    JVar2 = cinfo->image_width;
    for (lVar8 = 0; JVar2 != (JDIMENSION)lVar8; lVar8 = lVar8 + 1) {
      iVar5 = LZWReadByte((gif_source_ptr)sinfo);
      pJVar4[lVar8] = (JSAMPLE)iVar5;
    }
    uVar9 = uVar9 + 1;
  }
  if (pjVar3 != (jpeg_progress_mgr *)0x0) {
    *(int *)&pjVar3[1].progress_monitor = *(int *)&pjVar3[1].progress_monitor + 1;
  }
  sinfo->get_pixel_rows = get_interlaced_row;
  sinfo[8].buffer_height = 0;
  uVar7 = uVar1 + 7 >> 3;
  *(uint *)&sinfo[8].field_0x2c = uVar7;
  iVar5 = (uVar1 + 3 >> 3) + uVar7;
  *(int *)&sinfo[9].start_input = iVar5;
  *(uint *)((long)&sinfo[9].start_input + 4) = (uVar1 + 1 >> 2) + iVar5;
  get_interlaced_row(cinfo,sinfo);
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
load_interlaced_image(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  gif_source_ptr source = (gif_source_ptr)sinfo;
  register JSAMPROW sptr;
  register JDIMENSION col;
  JDIMENSION row;
  cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;

  /* Read the interlaced image into the virtual array we've created. */
  for (row = 0; row < cinfo->image_height; row++) {
    if (progress != NULL) {
      progress->pub.pass_counter = (long)row;
      progress->pub.pass_limit = (long)cinfo->image_height;
      (*progress->pub.progress_monitor) ((j_common_ptr)cinfo);
    }
    sptr = *(*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, source->interlaced_image, row, (JDIMENSION)1,
       TRUE);
    for (col = cinfo->image_width; col > 0; col--) {
      *sptr++ = (JSAMPLE)LZWReadByte(source);
    }
  }
  if (progress != NULL)
    progress->completed_extra_passes++;

  /* Replace method pointer so subsequent calls don't come here. */
  source->pub.get_pixel_rows = get_interlaced_row;
  /* Initialize for get_interlaced_row, and perform first call on it. */
  source->cur_row_number = 0;
  source->pass2_offset = (cinfo->image_height + 7) / 8;
  source->pass3_offset = source->pass2_offset + (cinfo->image_height + 3) / 8;
  source->pass4_offset = source->pass3_offset + (cinfo->image_height + 1) / 4;

  return get_interlaced_row(cinfo, sinfo);
}